

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateDependencyManifestFile
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,GeneratorContextMap *output_directories,DiskSourceTree *source_tree)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  string *virtual_file;
  bool bVar2;
  int iVar3;
  pointer ppFVar4;
  _Hash_node_base *p_Var5;
  int *piVar6;
  Type *pTVar7;
  ostream *poVar8;
  long lVar9;
  char *text;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_output_filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_filenames;
  FileDescriptorSet file_set;
  FileOutputStream out;
  Printer printer;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 local_188;
  DiskSourceTree *local_180;
  CommandLineInterface *local_178;
  _Hash_node_base *local_170;
  FileDescriptorSet local_168;
  undefined1 local_138 [16];
  _func_int *local_128 [8];
  undefined1 local_e8 [136];
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_60;
  
  local_180 = source_tree;
  local_178 = this;
  FileDescriptorSet::FileDescriptorSet(&local_168);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppFVar4 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar10 = 0;
    do {
      GetTransitiveDependencies
                (ppFVar4[uVar10],false,false,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_60,&local_168.file_);
      uVar10 = uVar10 + 1;
      ppFVar4 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3
                             ));
  }
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = 0;
  local_188 = 0;
  p_Var5 = (output_directories->
           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
           )._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      local_170 = p_Var5;
      GeneratorContextImpl::GetOutputFilenames
                ((GeneratorContextImpl *)p_Var5[5]._M_nxt,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8);
      if (local_1b8._8_8_ != local_1b8._0_8_) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_170 + 1)
        ;
        lVar9 = 0;
        uVar10 = 0;
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1b8._0_8_ + lVar9));
          iVar3 = std::__cxx11::string::compare((ulong)local_e8,0,(char *)0x2);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)local_138,(ulong)local_e8);
            std::__cxx11::string::operator=((string *)local_e8,(string *)local_138);
            if ((_func_int **)local_138._0_8_ != local_128) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_128[0] + 1));
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_198,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8)
          ;
          if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (ulong)((long)(local_1b8._8_8_ - local_1b8._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
      p_Var5 = local_170->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  while (iVar3 = open((local_178->dependency_out_name_)._M_dataplus._M_p,0x241,0x1b6), iVar3 < 0) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      perror((local_178->dependency_out_name_)._M_dataplus._M_p);
      bVar2 = false;
LAB_00205b53:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198);
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~_Rb_tree(&local_60);
      FileDescriptorSet::~FileDescriptorSet(&local_168);
      return bVar2;
    }
  }
  io::FileOutputStream::FileOutputStream((FileOutputStream *)local_138,iVar3,-1);
  io::Printer::Printer((Printer *)local_e8,(ZeroCopyOutputStream *)local_138,'$');
  if (local_198._8_8_ != local_198._M_allocated_capacity) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      io::Printer::Print((Printer *)local_e8,*(char **)(local_198._M_allocated_capacity + lVar9));
      text = " \\\n";
      if (uVar10 == ((long)(local_198._8_8_ - local_198._0_8_) >> 5) - 1U) {
        text = ":";
      }
      io::Printer::Print((Printer *)local_e8,text);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < (ulong)((long)(local_198._8_8_ - local_198._0_8_) >> 5));
  }
  bVar2 = true;
  if (0 < local_168.file_.super_RepeatedPtrFieldBase.current_size_) {
    iVar3 = 0;
    pbVar1 = (pointer)(local_1b8 + 0x10);
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                         (&local_168.file_.super_RepeatedPtrFieldBase,iVar3);
      virtual_file = (pTVar7->name_).ptr_;
      local_1b8._8_8_ = (pointer)0x0;
      local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
      local_1b8._0_8_ = pbVar1;
      if ((local_180 == (DiskSourceTree *)0x0) ||
         (bVar2 = DiskSourceTree::VirtualFileToDiskFile(local_180,virtual_file,(string *)local_1b8),
         !bVar2)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to identify path for file ",0x21);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(virtual_file->_M_dataplus)._M_p,
                            virtual_file->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((pointer)local_1b8._0_8_ != pbVar1) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
        bVar2 = false;
        goto LAB_00205b39;
      }
      io::Printer::Print((Printer *)local_e8," $disk_file$","disk_file",(string *)local_1b8);
      if (iVar3 < local_168.file_.super_RepeatedPtrFieldBase.current_size_ + -1) {
        io::Printer::Print((Printer *)local_e8,"\\\n");
      }
      if ((pointer)local_1b8._0_8_ != pbVar1) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_168.file_.super_RepeatedPtrFieldBase.current_size_);
    bVar2 = true;
  }
LAB_00205b39:
  io::Printer::~Printer((Printer *)local_e8);
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_138);
  goto LAB_00205b53;
}

Assistant:

bool CommandLineInterface::GenerateDependencyManifestFile(
    const std::vector<const FileDescriptor*>& parsed_files,
    const GeneratorContextMap& output_directories,
    DiskSourceTree* source_tree) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              false,
                              false,
                              &already_seen,
                              file_set.mutable_file());
  }

  std::vector<string> output_filenames;
  for (GeneratorContextMap::const_iterator iter = output_directories.begin();
       iter != output_directories.end(); ++iter) {
    const string& location = iter->first;
    GeneratorContextImpl* directory = iter->second;
    std::vector<string> relative_output_filenames;
    directory->GetOutputFilenames(&relative_output_filenames);
    for (int i = 0; i < relative_output_filenames.size(); i++) {
      string output_filename = location + relative_output_filenames[i];
      if (output_filename.compare(0, 2, "./") == 0) {
        output_filename = output_filename.substr(2);
      }
      output_filenames.push_back(output_filename);
    }
  }

  int fd;
  do {
    fd = open(dependency_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(dependency_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  io::Printer printer(&out, '$');

  for (int i = 0; i < output_filenames.size(); i++) {
    printer.Print(output_filenames[i].c_str());
    if (i == output_filenames.size() - 1) {
      printer.Print(":");
    } else {
      printer.Print(" \\\n");
    }
  }

  for (int i = 0; i < file_set.file_size(); i++) {
    const FileDescriptorProto& file = file_set.file(i);
    const string& virtual_file = file.name();
    string disk_file;
    if (source_tree &&
        source_tree->VirtualFileToDiskFile(virtual_file, &disk_file)) {
      printer.Print(" $disk_file$", "disk_file", disk_file);
      if (i < file_set.file_size() - 1) printer.Print("\\\n");
    } else {
      std::cerr << "Unable to identify path for file " << virtual_file
                << std::endl;
      return false;
    }
  }

  return true;
}